

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O0

void __thiscall duckdb::Transformer::Transformer(Transformer *this,ParserOptions *options)

{
  Transformer *in_RSI;
  optional_ptr<duckdb::Transformer,_true> *in_RDI;
  
  optional_ptr<duckdb::Transformer,_true>::optional_ptr(in_RDI,(Transformer *)0x0);
  in_RDI[1].ptr = in_RSI;
  in_RDI[2].ptr = (Transformer *)0x0;
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)0x23bd3e);
  *(undefined1 *)&in_RDI[10].ptr = 3;
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb_libpgquery::PGWindowDef_*>_>_>
                   *)0x23bd4f);
  vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_true>
  ::vector((vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_true>
            *)0x23bd5f);
  vector<duckdb::CommonTableExpressionMap_*,_true>::vector
            ((vector<duckdb::CommonTableExpressionMap_*,_true> *)0x23bd6f);
  *(undefined1 *)&in_RDI[0x18].ptr = 0;
  in_RDI[0x19].ptr = (Transformer *)0xffffffffffffffff;
  return;
}

Assistant:

Transformer::Transformer(ParserOptions &options)
    : parent(nullptr), options(options), stack_depth(DConstants::INVALID_INDEX) {
}